

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O1

float deqp::gles2::Performance::vectorFloatStandardDeviation<long>
                (vector<long,_std::allocator<long>_> *v)

{
  pointer plVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  plVar1 = (v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar3 = (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
                ._M_finish - (long)plVar1 >> 3;
  uVar2 = (uint)uVar3;
  if ((int)uVar2 < 1) {
    fVar6 = 0.0;
  }
  else {
    fVar6 = 0.0;
    uVar4 = 0;
    do {
      fVar6 = fVar6 + (float)plVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar4);
  }
  fVar7 = (float)uVar3;
  fVar5 = 0.0;
  if (0 < (int)uVar2) {
    uVar3 = 0;
    do {
      fVar8 = (float)plVar1[uVar3] - fVar6 / fVar7;
      fVar5 = fVar5 + fVar8 * fVar8;
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar3);
  }
  fVar5 = fVar5 / fVar7;
  if (0.0 <= fVar5) {
    return SQRT(fVar5);
  }
  fVar6 = sqrtf(fVar5);
  return fVar6;
}

Assistant:

static float vectorFloatStandardDeviation (const vector<T>& v)
{
	float average	= vectorFloatAverage(v);
	float result	= 0.0f;
	for (int i = 0; i < (int)v.size(); i++)
	{
		float d = (float)v[i] - average;
		result += d*d;
	}
	return deFloatSqrt(result/(float)v.size());
}